

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseText(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  bool bVar1;
  Bool BVar2;
  Node *node;
  GetTokenMode mode_00;
  
  doc->lexer->insert = (IStack *)0x0;
  if (((field == (Node *)0x0) || (field->tag == (Dict *)0x0)) ||
     (field->tag->id != TidyTag_TEXTAREA)) {
    mode_00 = MixedContent;
    bVar1 = false;
  }
  else {
    mode_00 = Preformatted;
    bVar1 = true;
  }
LAB_0013bf68:
  do {
    node = prvTidyGetToken(doc,mode_00);
    if (node == (Node *)0x0) {
      if ((field->tag->model & 0x8000) == 0) {
        prvTidyReport(doc,field,(Node *)0x0,0x25a);
      }
      return (Node *)0x0;
    }
    if ((node->tag == field->tag) && (node->type == EndTag)) {
      prvTidyFreeNode(doc,node);
      field->closed = yes;
      goto LAB_0013c071;
    }
    BVar2 = InsertMisc(field,node);
  } while (BVar2 != no);
  BVar2 = prvTidynodeIsText(node);
  if (BVar2 == no) {
    if ((node->tag == (Dict *)0x0) || ((node->tag->model & 0x410) != 0x10)) {
      if ((field->tag->model & 0x8000) == 0) {
        prvTidyReport(doc,field,node,0x259);
      }
      prvTidyUngetToken(doc);
LAB_0013c071:
      TrimSpaces(doc,field);
      return (Node *)0x0;
    }
    prvTidyReport(doc,field,node,0x235);
  }
  else {
    if (field->content == (Node *)0x0 && !bVar1) {
      TrimSpaces(doc,field);
    }
    if (node->start < node->end) {
      prvTidyInsertNodeAtEnd(field,node);
      goto LAB_0013bf68;
    }
  }
  prvTidyFreeNode(doc,node);
  goto LAB_0013bf68;
}

Assistant:

Node* TY_(ParseText)( TidyDocImpl* doc, Node *field, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;
    
    DEBUG_LOG_ENTER_WITH_NODE(field);

    lexer->insert = NULL;  /* defer implicit inline start tags */

    DEBUG_LOG_GET_OLD_MODE;
    if ( nodeIsTEXTAREA(field) )
        mode = Preformatted;
    else
        mode = MixedContent;  /* kludge for font tags */
    DEBUG_LOG_CHANGE_MODE;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (field->content == NULL && !(mode & Preformatted))
                TrimSpaces(doc, field);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(field, node);
            continue;
        }

        /* for textarea should all cases of < and & be escaped? */

        /* discard inline tags e.g. font */
        if (   node->tag
            && node->tag->model & CM_INLINE
            && !(node->tag->model & CM_FIELD)) /* #487283 - fix by Lee Passey 25 Jan 02 */
        {
            TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* terminate element on other tags */
        if (!(field->tag->model & CM_OPT))
            TY_(Report)(doc, field, node, MISSING_ENDTAG_BEFORE);

        TY_(UngetToken)( doc );
        TrimSpaces(doc, field);
        DEBUG_LOG_EXIT;
        return NULL;
    }

    if (!(field->tag->model & CM_OPT))
        TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}